

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O2

vector<int,_std::allocator<int>_> * anon_unknown.dwarf_4495f9::AllCurves(void)

{
  size_t __n;
  vector<int,_std::allocator<int>_> *in_RDI;
  anon_struct_16_2_e7b2e0df *curve;
  pointer __x;
  vector<EC_builtin_curve,_std::allocator<EC_builtin_curve>_> curves;
  allocator_type local_31;
  _Vector_base<EC_builtin_curve,_std::allocator<EC_builtin_curve>_> local_30;
  
  __n = EC_get_builtin_curves((EC_builtin_curve *)0x0,0);
  std::vector<EC_builtin_curve,_std::allocator<EC_builtin_curve>_>::vector
            ((vector<EC_builtin_curve,_std::allocator<EC_builtin_curve>_> *)&local_30,__n,&local_31)
  ;
  EC_get_builtin_curves((EC_builtin_curve *)local_30._M_impl.super__Vector_impl_data._M_start,__n);
  (in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  for (__x = local_30._M_impl.super__Vector_impl_data._M_start;
      __x != local_30._M_impl.super__Vector_impl_data._M_finish;
      __x = (pointer)((EC_builtin_curve *)__x + 1)) {
    std::vector<int,_std::allocator<int>_>::push_back(in_RDI,&__x->nid);
  }
  std::_Vector_base<EC_builtin_curve,_std::allocator<EC_builtin_curve>_>::~_Vector_base(&local_30);
  return in_RDI;
}

Assistant:

static std::vector<int> AllCurves() {
  const size_t num_curves = EC_get_builtin_curves(nullptr, 0);
  std::vector<EC_builtin_curve> curves(num_curves);
  EC_get_builtin_curves(curves.data(), num_curves);
  std::vector<int> nids;
  for (const auto &curve : curves) {
    nids.push_back(curve.nid);
  }
  return nids;
}